

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_alloc.c
# Opt level: O1

light_pcapng light_alloc_block(uint32_t block_type,uint32_t *block_body,uint32_t block_body_length)

{
  light_pcapng p_Var1;
  uint32_t *__dest;
  uint uVar2;
  
  p_Var1 = (light_pcapng)calloc(1,0x20);
  p_Var1->block_type = block_type;
  uVar2 = block_body_length + 3 & 0xfffffffc;
  p_Var1->block_total_lenght = uVar2 + 0xc;
  if (0 < (int)uVar2) {
    __dest = (uint32_t *)calloc(1,(ulong)uVar2);
    p_Var1->block_body = __dest;
    memcpy(__dest,block_body,(ulong)uVar2);
  }
  p_Var1->options = (_light_option *)0x0;
  p_Var1->next_block = (_light_pcapng *)0x0;
  return p_Var1;
}

Assistant:

light_pcapng light_alloc_block(uint32_t block_type, const uint32_t *block_body, uint32_t block_body_length)
{
	struct _light_pcapng *pcapng_block = calloc(1, sizeof(struct _light_pcapng));
	uint32_t actual_size = 0;
	int32_t block_body_size;

	pcapng_block->block_type = block_type;

	PADD32(block_body_length, &actual_size);

	pcapng_block->block_total_lenght = actual_size + 2 * sizeof(pcapng_block->block_total_lenght) + sizeof(pcapng_block->block_type); // This value MUST be a multiple of 4.
	block_body_size = actual_size;

	if (block_body_size > 0) {
		pcapng_block->block_body = calloc(1, block_body_size);
		memcpy(pcapng_block->block_body, block_body, block_body_size);
	}

	pcapng_block->next_block = NULL;
	pcapng_block->options = NULL;

	return pcapng_block;
}